

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.cpp
# Opt level: O2

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::StoreLPJointObservation::Store
          (StoreLPJointObservation *this)

{
  ParserPOMDPFormat_Spirit *pPVar1;
  pointer puVar2;
  ostream *poVar3;
  EParse *this_00;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1b0;
  stringstream msg;
  ostream local_188 [376];
  
  pPVar1 = this->_m_po;
  puVar2 = (pPVar1->_m_lp_JOI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pPVar1->_m_lp_JOI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (pPVar1->_m_lp_JOI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  if (this->_m_isJointObservationIndex != true) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1b0,&pPVar1->_m_lp_JO);
    MatchingJointObservations
              (this,0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1b0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1b0);
    pPVar1 = this->_m_po;
    puVar2 = (pPVar1->_m_lp_JO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((pPVar1->_m_lp_JO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar2) {
      (pPVar1->_m_lp_JO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
    }
    return;
  }
  puVar2 = (pPVar1->_m_lp_JO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pPVar1->_m_lp_JO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (pPVar1->_m_lp_JO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  if (pPVar1->_m_lp_type == UINT) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&pPVar1->_m_lp_JOI,&pPVar1->_m_lp_uint);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  poVar3 = std::operator<<(local_188,
                           "StoreLPJointObservation::Store() requires that last parsed element is a UINT! (last parsed index was a joint action index)"
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  this_00 = (EParse *)__cxa_allocate_exception(0x28);
  EParse::EParse(this_00,&msg);
  __cxa_throw(this_00,&EParse::typeinfo,E::~E);
}

Assistant:

void ParserPOMDPFormat_Spirit::StoreLPJointObservation::Store() const
{
    _m_po->_m_lp_JOI.clear();
    if(_m_isJointObservationIndex) //as opposed to parsing individual indices
    {
        //_m_lp_JO not necessary: clear it.
        _m_po->_m_lp_JO.clear();
        //do check that the last parsed element was a index (uint)
        if (_m_po->_m_lp_type != UINT)
        {
            stringstream msg;
            msg << "StoreLPJointObservation::Store() requires that last parsed element is a UINT! (last parsed index was a joint action index)"<< endl;
            throw EParse(msg);
        }
        _m_po->_m_lp_JOI.push_back(_m_po->_m_lp_uint);
        return;
    }
    MatchingJointObservations(0,_m_po->_m_lp_JO); 
    _m_po->_m_lp_JO.clear();
}